

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegularExpression.cpp
# Opt level: O2

bool __thiscall
xercesc_4_0::RegularExpression::matchString
          (RegularExpression *this,Context *context,XMLCh *literal,XMLSize_t *offset,bool ignoreCase
          )

{
  bool bVar1;
  XMLSize_t charCount;
  bool bVar2;
  int offset1;
  
  charCount = XMLString::stringLen(literal);
  if (context->fLimit - *offset < charCount) {
    bVar2 = false;
  }
  else {
    offset1 = (int)*offset;
    if (ignoreCase) {
      bVar1 = XMLString::regionIMatches(context->fString,offset1,literal,0,charCount);
    }
    else {
      bVar1 = XMLString::regionMatches(context->fString,offset1,literal,0,charCount);
    }
    bVar2 = false;
    if (bVar1 != false) {
      *offset = *offset + charCount;
      bVar2 = true;
    }
  }
  return bVar2;
}

Assistant:

bool RegularExpression::matchString(Context* const context,
                                    const XMLCh* const literal, XMLSize_t& offset,
                                    const bool ignoreCase) const
{
    XMLSize_t length = XMLString::stringLen(literal);

    if (context->fLimit - offset < length)
        return false;

    bool match = ignoreCase ? XMLString::regionIMatches(context->fString, (int)offset,
                                                        literal, 0, length)
                            : XMLString::regionMatches(context->fString, (int)offset,
                                                       literal, 0, length);
    if (match) offset += length;
    return match;
}